

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_bauth.c
# Opt level: O0

size_t btokBAuthCT_keep(size_t l)

{
  ulong uVar1;
  size_t sVar2;
  long in_RDI;
  size_t no;
  size_t n;
  bign_deep_i in_stack_00000038;
  size_t in_stack_00000040;
  
  uVar1 = in_RDI * 2 + 7;
  sVar2 = bignStart_keep(in_stack_00000040,in_stack_00000038);
  return sVar2 + 0x200 + (in_RDI * 2 + 0x3fU >> 6) * 0x10 + (uVar1 >> 3) + (uVar1 >> 4);
}

Assistant:

size_t btokBAuthCT_keep(size_t l)
{
	const size_t n = W_OF_B(2 * l);
	const size_t no = O_OF_B(2 * l);
	return sizeof(bake_bauth_ct_o) +
		bignStart_keep(l, btokBAuthCT_deep) +
		2 * O_OF_W(n) + no + no / 2;
}